

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O0

void ourWriteOut(CURL *curl,OutStruct *outs,char *writeinfo)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  char *local_68;
  char *version;
  int local_58;
  _Bool match;
  int i;
  char keepit;
  char *end;
  double doubleinfo;
  long longinfo;
  char *stringp;
  char *ptr;
  FILE *stream;
  char *writeinfo_local;
  OutStruct *outs_local;
  CURL *curl_local;
  
  ptr = _stdout;
  longinfo = 0;
  stringp = writeinfo;
  stream = (FILE *)writeinfo;
  writeinfo_local = (char *)outs;
  outs_local = (OutStruct *)curl;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            bVar4 = false;
            if (stringp != (char *)0x0) {
              bVar4 = *stringp != '\0';
            }
            if (!bVar4) {
              return;
            }
            if ((*stringp == '%') && (stringp[1] != '\0')) break;
            if ((*stringp == '\\') && (stringp[1] != '\0')) {
              cVar1 = stringp[1];
              if (cVar1 == 'n') {
                fputc(10,(FILE *)ptr);
              }
              else if (cVar1 == 'r') {
                fputc(0xd,(FILE *)ptr);
              }
              else if (cVar1 == 't') {
                fputc(9,(FILE *)ptr);
              }
              else {
                fputc((int)*stringp,(FILE *)ptr);
                fputc((int)stringp[1],(FILE *)ptr);
              }
              stringp = stringp + 2;
            }
            else {
              fputc((int)*stringp,(FILE *)ptr);
              stringp = stringp + 1;
            }
          }
          if (stringp[1] != '%') break;
          fputc(0x25,(FILE *)ptr);
          stringp = stringp + 2;
        }
        if (stringp[1] == '{') break;
        fputc(0x25,(FILE *)ptr);
        fputc((int)stringp[1],(FILE *)ptr);
        stringp = stringp + 2;
      }
      bVar4 = false;
      pcVar3 = strchr(stringp,0x7d);
      stringp = stringp + 2;
      if (pcVar3 != (char *)0x0) break;
      fputs("%{",(FILE *)ptr);
    }
    cVar1 = *pcVar3;
    *pcVar3 = '\0';
    local_58 = 0;
    while (replacements[local_58].name != (char *)0x0) {
      iVar2 = curl_strequal(stringp,replacements[local_58].name);
      if (iVar2 != 0) {
        bVar4 = true;
        switch(replacements[local_58].id) {
        case VAR_TOTAL_TIME:
          iVar2 = curl_easy_getinfo(outs_local,0x300003,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.6f");
          }
          break;
        case VAR_NAMELOOKUP_TIME:
          iVar2 = curl_easy_getinfo(outs_local,0x300004,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.6f");
          }
          break;
        case VAR_CONNECT_TIME:
          iVar2 = curl_easy_getinfo(outs_local,0x300005,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.6f");
          }
          break;
        case VAR_APPCONNECT_TIME:
          iVar2 = curl_easy_getinfo(outs_local,0x300021,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.6f");
          }
          break;
        case VAR_PRETRANSFER_TIME:
          iVar2 = curl_easy_getinfo(outs_local,0x300006,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.6f");
          }
          break;
        case VAR_STARTTRANSFER_TIME:
          iVar2 = curl_easy_getinfo(outs_local,0x300011,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.6f");
          }
          break;
        case VAR_SIZE_DOWNLOAD:
          iVar2 = curl_easy_getinfo(outs_local,0x300008,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.0f");
          }
          break;
        case VAR_SIZE_UPLOAD:
          iVar2 = curl_easy_getinfo(outs_local,0x300007,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.0f");
          }
          break;
        case VAR_SPEED_DOWNLOAD:
          iVar2 = curl_easy_getinfo(outs_local,0x300009,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.3f");
          }
          break;
        case VAR_SPEED_UPLOAD:
          iVar2 = curl_easy_getinfo(outs_local,0x30000a,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.3f");
          }
          break;
        case VAR_HTTP_CODE:
          iVar2 = curl_easy_getinfo(outs_local,0x200002,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%03ld",doubleinfo);
          }
          break;
        case VAR_HTTP_CODE_PROXY:
          iVar2 = curl_easy_getinfo(outs_local,0x200016,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%03ld",doubleinfo);
          }
          break;
        case VAR_HEADER_SIZE:
          iVar2 = curl_easy_getinfo(outs_local,0x20000b,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%ld",doubleinfo);
          }
          break;
        case VAR_REQUEST_SIZE:
          iVar2 = curl_easy_getinfo(outs_local,0x20000c,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%ld",doubleinfo);
          }
          break;
        case VAR_EFFECTIVE_URL:
          iVar2 = curl_easy_getinfo(outs_local,0x100001,&longinfo);
          if ((iVar2 == 0) && (longinfo != 0)) {
            fputs((char *)longinfo,(FILE *)ptr);
          }
          break;
        case VAR_CONTENT_TYPE:
          iVar2 = curl_easy_getinfo(outs_local,0x100012,&longinfo);
          if ((iVar2 == 0) && (longinfo != 0)) {
            fputs((char *)longinfo,(FILE *)ptr);
          }
          break;
        case VAR_NUM_CONNECTS:
          iVar2 = curl_easy_getinfo(outs_local,0x20001a,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%ld",doubleinfo);
          }
          break;
        case VAR_REDIRECT_TIME:
          iVar2 = curl_easy_getinfo(outs_local,0x300013,&end);
          if (iVar2 == 0) {
            curl_mfprintf(end,ptr,"%.6f");
          }
          break;
        case VAR_REDIRECT_COUNT:
          iVar2 = curl_easy_getinfo(outs_local,0x200014,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%ld",doubleinfo);
          }
          break;
        case VAR_FTP_ENTRY_PATH:
          iVar2 = curl_easy_getinfo(outs_local,0x10001e,&longinfo);
          if ((iVar2 == 0) && (longinfo != 0)) {
            fputs((char *)longinfo,(FILE *)ptr);
          }
          break;
        case VAR_REDIRECT_URL:
          iVar2 = curl_easy_getinfo(outs_local,0x10001f,&longinfo);
          if ((iVar2 == 0) && (longinfo != 0)) {
            fputs((char *)longinfo,(FILE *)ptr);
          }
          break;
        case VAR_SSL_VERIFY_RESULT:
          iVar2 = curl_easy_getinfo(outs_local,0x20000d,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%ld",doubleinfo);
          }
          break;
        case VAR_PROXY_SSL_VERIFY_RESULT:
          iVar2 = curl_easy_getinfo(outs_local,0x20002f,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%ld",doubleinfo);
          }
          break;
        case VAR_EFFECTIVE_FILENAME:
          if (*(long *)writeinfo_local != 0) {
            curl_mfprintf(ptr,"%s",*(undefined8 *)writeinfo_local);
          }
          break;
        case VAR_PRIMARY_IP:
          iVar2 = curl_easy_getinfo(outs_local,0x100020,&longinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%s",longinfo);
          }
          break;
        case VAR_PRIMARY_PORT:
          iVar2 = curl_easy_getinfo(outs_local,0x200028,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%ld",doubleinfo);
          }
          break;
        case VAR_LOCAL_IP:
          iVar2 = curl_easy_getinfo(outs_local,0x100029,&longinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%s",longinfo);
          }
          break;
        case VAR_LOCAL_PORT:
          iVar2 = curl_easy_getinfo(outs_local,0x20002a,&doubleinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%ld",doubleinfo);
          }
          break;
        case VAR_HTTP_VERSION:
          iVar2 = curl_easy_getinfo(outs_local,0x20002e,&doubleinfo);
          if (iVar2 == 0) {
            local_68 = "0";
            switch(doubleinfo) {
            case 4.94065645841247e-324:
              local_68 = "1.0";
              break;
            case 9.88131291682493e-324:
              local_68 = "1.1";
              break;
            case 1.48219693752374e-323:
              local_68 = "2";
              break;
            case 1.48219693752374e-322:
              local_68 = "3";
            }
            curl_mfprintf(ptr,local_68);
          }
          break;
        case VAR_SCHEME:
          iVar2 = curl_easy_getinfo(outs_local,0x100031,&longinfo);
          if (iVar2 == 0) {
            curl_mfprintf(ptr,"%s",longinfo);
          }
          break;
        case VAR_STDOUT:
          ptr = _stdout;
          break;
        case VAR_STDERR:
          ptr = _stderr;
        }
        break;
      }
      local_58 = local_58 + 1;
    }
    if (!bVar4) {
      curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",stringp);
    }
    stringp = pcVar3 + 1;
    *pcVar3 = cVar1;
  } while( true );
}

Assistant:

void ourWriteOut(CURL *curl, struct OutStruct *outs, const char *writeinfo)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  char *stringp = NULL;
  long longinfo;
  double doubleinfo;

  while(ptr && *ptr) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* zero terminate */
          for(i = 0; replacements[i].name; i++) {
            if(curl_strequal(ptr, replacements[i].name)) {
              match = TRUE;
              switch(replacements[i].id) {
              case VAR_EFFECTIVE_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_EFFECTIVE_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_HTTP_CODE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HTTP_CODE_PROXY:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_CONNECTCODE,
                                     &longinfo))
                  fprintf(stream, "%03ld", longinfo);
                break;
              case VAR_HEADER_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HEADER_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REQUEST_SIZE:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REQUEST_SIZE, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_NUM_CONNECTS:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NUM_CONNECTS, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_COUNT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_COUNT, &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_REDIRECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_REDIRECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_TOTAL_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_TOTAL_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_NAMELOOKUP_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_NAMELOOKUP_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_CONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_CONNECT_TIME, &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_APPCONNECT_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_APPCONNECT_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_PRETRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRETRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_STARTTRANSFER_TIME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_STARTTRANSFER_TIME,
                                     &doubleinfo))
                  fprintf(stream, "%.6f", doubleinfo);
                break;
              case VAR_SIZE_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SIZE_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SIZE_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.0f", doubleinfo);
                break;
              case VAR_SPEED_DOWNLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD,
                                     &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_SPEED_UPLOAD:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SPEED_UPLOAD, &doubleinfo))
                  fprintf(stream, "%.3f", doubleinfo);
                break;
              case VAR_CONTENT_TYPE:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_CONTENT_TYPE, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_FTP_ENTRY_PATH:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_FTP_ENTRY_PATH, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_REDIRECT_URL:
                if((CURLE_OK ==
                    curl_easy_getinfo(curl, CURLINFO_REDIRECT_URL, &stringp))
                   && stringp)
                  fputs(stringp, stream);
                break;
              case VAR_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_PROXY_SSL_VERIFY_RESULT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PROXY_SSL_VERIFYRESULT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_EFFECTIVE_FILENAME:
                if(outs->filename)
                  fprintf(stream, "%s", outs->filename);
                break;
              case VAR_PRIMARY_IP:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_IP,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_PRIMARY_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_PRIMARY_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_LOCAL_IP:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_IP,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_LOCAL_PORT:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_LOCAL_PORT,
                                     &longinfo))
                  fprintf(stream, "%ld", longinfo);
                break;
              case VAR_HTTP_VERSION:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_HTTP_VERSION,
                                     &longinfo)) {
                  const char *version = "0";
                  switch(longinfo) {
                  case CURL_HTTP_VERSION_1_0:
                    version = "1.0";
                    break;
                  case CURL_HTTP_VERSION_1_1:
                    version = "1.1";
                    break;
                  case CURL_HTTP_VERSION_2_0:
                    version = "2";
                    break;
                  case CURL_HTTP_VERSION_3:
                    version = "3";
                    break;
                  }

                  fprintf(stream, version);
                }
                break;
              case VAR_SCHEME:
                if(CURLE_OK ==
                   curl_easy_getinfo(curl, CURLINFO_SCHEME,
                                     &stringp))
                  fprintf(stream, "%s", stringp);
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              default:
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }

}